

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask15_32(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  long unaff_RBP;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  
  vpmovsxbd_avx2(ZEXT816(0x4438302820181008));
  vpmovsxbd_avx2(ZEXT816(0x40342c241c140c04));
  vpmovsxbd_avx(ZEXT416(0x60585048));
  uVar1 = in[0x1f];
  auVar13 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[0xf] * 2)));
  auVar10 = vpsrlvd_avx2(auVar13._0_16_,_DAT_001971f0);
  auVar14 = vpgatherdd_avx512vl(*in);
  auVar8 = vpsllvd_avx2(auVar14,_DAT_00195a60);
  auVar9 = vpsllvd_avx2(auVar13,_DAT_00195aa0);
  auVar14 = valignd_avx512vl(ZEXT1632(auVar10),ZEXT1632(auVar10),7);
  uVar2 = in[0x1b];
  auVar14 = vpblendd_avx2(auVar14,ZEXT432(*in),1);
  auVar10 = vpshufd_avx(auVar13._16_16_,0x50);
  auVar10 = vpsrlvd_avx2(auVar10,_DAT_00199050);
  auVar15._0_16_ = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar14._0_16_;
  auVar15._16_16_ = ZEXT116(0) * auVar14._16_16_ + ZEXT116(1) * auVar10;
  auVar14 = vpblendd_avx2(auVar14,auVar15,0x60);
  auVar15 = vpbroadcastd_avx512vl();
  uVar3 = in[0x1d];
  auVar14 = vpblendd_avx2(auVar14,auVar15,0x80);
  auVar14 = vpternlogd_avx512vl(auVar9,auVar8,auVar14,0xfe);
  vpmovsxbd_avx(ZEXT416(0x645c544c));
  *(undefined1 (*) [32])out = auVar14;
  auVar10 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + unaff_RBP));
  auVar6 = vpsllvd_avx2(auVar10,_DAT_00199080);
  auVar11 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar2));
  auVar7 = vpsllvd_avx2(auVar11,_DAT_00199090);
  auVar10 = vpalignr_avx(auVar11,auVar13._16_16_,0xc);
  auVar10 = vpsrlvd_avx2(auVar10,_DAT_00197230);
  auVar12 = vpternlogd_avx512vl(auVar7,auVar6,auVar10,0xfe);
  uVar4 = in[0x1a];
  auVar10 = vpshufd_avx(auVar11,0xff);
  auVar10 = vpinsrd_avx(auVar10,uVar2,1);
  auVar6 = vpinsrd_avx(ZEXT416(uVar2),uVar3,1);
  auVar7 = vpsrlvd_avx2(auVar10,_DAT_00197250);
  auVar6 = vpsllvd_avx2(auVar6,_DAT_001990c0);
  uVar5 = in[0x1e];
  *(undefined1 (*) [16])(out + 8) = auVar12;
  auVar10 = vpinsrd_avx(ZEXT416(uVar4),in[0x1c],1);
  auVar10 = vpsllvd_avx2(auVar10,_DAT_001972e0);
  auVar10 = vpternlogd_avx512vl(auVar6,auVar10,auVar7,0xfe);
  *(long *)(out + 0xc) = auVar10._0_8_;
  out[0xe] = uVar1 << 0x11 | uVar5 << 2 | uVar3 >> 0xd;
  return out + 0xf;
}

Assistant:

uint32_t *__fastpackwithoutmask15_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (15 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (15 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (15 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (15 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (15 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (15 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (15 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (15 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (15 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (15 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (15 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (15 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (15 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (15 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  ++in;

  return out;
}